

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneT.cpp
# Opt level: O1

void __thiscall
PermutazioneT::randomSS
          (PermutazioneT *this,PermutazioneT *p,unsigned_short *spostamenti,double F,Coppia *coppie)

{
  ushort uVar1;
  unsigned_short *puVar2;
  result_type rVar3;
  void *pvVar4;
  void *__s;
  void *pvVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  PermutazioneT *pPVar11;
  ulong uVar12;
  void *pvVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  uint local_80;
  uint local_7c;
  double local_78;
  ulong local_70;
  void *local_68;
  ulong local_60;
  PermutazioneT *local_58;
  int local_4c;
  ushort *local_48;
  uniform_int_distribution<int> local_40;
  Coppia *local_38;
  
  uVar7 = (p->super_Permutazione).dimensione;
  uVar17 = (ulong)uVar7;
  local_78 = F;
  local_58 = p;
  local_48 = spostamenti;
  local_38 = coppie;
  local_68 = operator_new__((ulong)((uint)uVar7 * 8));
  uVar6 = (ulong)((uint)uVar7 + (uint)uVar7);
  pvVar4 = operator_new__(uVar6);
  __s = operator_new__(uVar17);
  uVar12 = 0;
  memset(__s,0,uVar17);
  memset(pvVar4,0,uVar6);
  pvVar13 = local_68;
  if (uVar7 != 0) {
    uVar18 = 0;
    local_70 = uVar6;
    do {
      pvVar5 = operator_new__(local_70);
      *(void **)((long)pvVar13 + uVar18 * 8) = pvVar5;
      uVar18 = uVar18 + 1;
    } while (uVar17 != uVar18);
  }
  uVar6 = (ulong)local_7c;
  if ((local_58->super_Permutazione).dimensione == 0) {
    dVar20 = 0.0;
    uVar17 = 0;
    uVar8 = 0;
    uVar7 = 0;
  }
  else {
    uVar12 = 0;
    uVar8 = 0;
    uVar17 = 0;
    dVar20 = 0.0;
    do {
      if (*(char *)((long)__s + uVar12) == '\0') {
        uVar18 = uVar17 & 0xffff;
        uVar6 = uVar12 & 0xffffffff;
        if (*(char *)((long)__s + uVar12) == '\0') {
          lVar9 = *(long *)((long)local_68 + uVar18 * 8);
          puVar2 = (local_58->super_Permutazione).individuo;
          uVar6 = uVar12;
          uVar15 = uVar12 & 0xffffffff;
          do {
            uVar7 = *(ushort *)((long)pvVar4 + uVar18 * 2);
            *(ushort *)((long)pvVar4 + uVar18 * 2) = uVar7 + 1;
            *(short *)(lVar9 + (ulong)uVar7 * 2) = (short)uVar15;
            *(undefined1 *)((long)__s + uVar6) = 1;
            uVar6 = (ulong)puVar2[uVar6];
            uVar15 = uVar6;
          } while (*(char *)((long)__s + uVar6) != '\x01');
        }
        uVar8 = uVar8 + 1;
        uVar7 = *(ushort *)((long)pvVar4 + uVar18 * 2);
        if (uVar7 < 2) {
          *(undefined2 *)((long)pvVar4 + uVar18 * 2) = 0;
        }
        else {
          dVar20 = (double)(ulong)(SUB84(dVar20,0) + ((uVar7 - 1) * (uint)uVar7 >> 1));
          uVar17 = (ulong)((int)uVar17 + 1);
        }
      }
      local_7c = (uint)uVar6;
      uVar12 = uVar12 + 1;
      uVar7 = (local_58->super_Permutazione).dimensione;
    } while (uVar12 < uVar7);
    uVar8 = uVar8 & 0xffff;
  }
  local_80 = (uint)uVar12;
  dVar21 = ceil((double)(int)(uVar7 - uVar8) * local_78);
  *local_48 = 0;
  pvVar13 = local_68;
  if (((short)uVar17 != 0) && (local_4c = (int)dVar21, 0 < local_4c)) {
    uVar8 = 0;
    do {
      local_60 = (ulong)uVar8;
      local_40._M_param._M_b = SUB84(dVar20,0) + -1;
      local_40._M_param._M_a = 0;
      rVar3 = std::uniform_int_distribution<int>::operator()
                        (&local_40,&genRand.gen,&local_40._M_param);
      uVar7 = 1;
      if (1 < (ushort)uVar17) {
        uVar7 = (ushort)uVar17;
      }
      uVar8 = (uint)uVar7;
      uVar12 = 0;
      iVar14 = 0;
      do {
        uVar1 = *(ushort *)((long)pvVar4 + uVar12 * 2);
        iVar14 = (int)((uVar1 - 1) * (uint)uVar1) / 2 + iVar14;
        if (rVar3 < iVar14) {
          uVar8 = (uint)uVar12;
          break;
        }
        uVar12 = uVar12 + 1;
      } while (uVar7 != uVar12);
      local_70 = CONCAT44(local_70._4_4_,(int)uVar17);
      uVar12 = (ulong)uVar8;
      Random::dueIndiciRandom
                (&genRand,(uint)*(ushort *)((long)pvVar4 + uVar12 * 2),(int *)&local_80,
                 (int *)&local_7c);
      uVar16 = local_80;
      pvVar5 = *(void **)((long)pvVar13 + uVar12 * 8);
      uVar7 = *local_48;
      local_38[uVar7].x = (uint)*(ushort *)((long)pvVar5 + (long)(int)local_80 * 2);
      local_38[uVar7].y = (uint)*(ushort *)((long)pvVar5 + (long)(int)local_7c * 2);
      *local_48 = uVar7 + 1;
      uVar7 = *(ushort *)((long)pvVar4 + uVar12 * 2);
      if ((int)local_7c < (int)local_80) {
        local_80 = local_7c;
        local_7c = uVar16;
      }
      local_78 = (double)(ulong)(uint)(SUB84(dVar20,0) - (int)((uVar7 - 1) * (uint)uVar7) / 2);
      lVar9 = (long)(int)local_80;
      iVar14 = (local_80 - local_7c) + (uint)uVar7;
      iVar19 = local_7c - local_80;
      if (iVar19 < 2 || iVar14 < 2) {
        if (iVar19 == 1 && 1 < iVar14) {
          if (0 < (int)(~local_7c + (uint)uVar7)) {
            memmove((void *)((long)pvVar5 + lVar9 * 2 + 2),
                    (void *)((long)pvVar5 + (long)(int)local_7c * 2 + 2),
                    (ulong)((~local_7c + (uint)uVar7) * 2));
          }
          *(short *)((long)pvVar4 + uVar12 * 2) = (short)iVar14;
          uVar8 = (iVar14 + -1) * iVar14;
        }
        else {
          if (iVar19 < 2) {
            uVar16 = (int)local_70 - 1;
            uVar17 = (ulong)uVar16;
            uVar6 = (ulong)(ushort)uVar16;
            dVar20 = local_78;
            if (uVar8 != (uVar16 & 0xffff)) {
              memcpy(pvVar5,*(void **)((long)pvVar13 + uVar6 * 8),
                     (ulong)((uint)*(ushort *)((long)pvVar4 + uVar6 * 2) * 2));
              *(undefined2 *)((long)pvVar4 + uVar12 * 2) = *(undefined2 *)((long)pvVar4 + uVar6 * 2)
              ;
              dVar20 = local_78;
            }
            goto LAB_001088f2;
          }
          memmove(pvVar5,(void *)((long)pvVar5 + lVar9 * 2 + 2),(ulong)(uint)(iVar19 * 2));
          *(short *)((long)pvVar4 + uVar12 * 2) = (short)iVar19;
          uVar8 = (iVar19 + -1) * iVar19;
        }
        uVar17 = local_70 & 0xffffffff;
        dVar20 = (double)(ulong)((uVar8 >> 1) + local_78._0_4_);
      }
      else {
        uVar6 = local_70 & 0xffff;
        memcpy(*(void **)((long)local_68 + uVar6 * 8),(void *)((long)pvVar5 + lVar9 * 2 + 2),
               (ulong)(uint)(iVar19 * 2));
        pvVar13 = local_68;
        *(short *)((long)pvVar4 + uVar6 * 2) = (short)iVar19;
        iVar10 = ~local_7c + (uint)*(ushort *)((long)pvVar4 + uVar12 * 2);
        if (0 < iVar10) {
          lVar9 = *(long *)((long)local_68 + uVar12 * 8);
          memmove((void *)(lVar9 + (long)(int)local_80 * 2 + 2),
                  (void *)(lVar9 + (long)(int)local_7c * 2 + 2),(ulong)(uint)(iVar10 * 2));
        }
        *(short *)((long)pvVar4 + uVar12 * 2) = (short)iVar14;
        uVar17 = (ulong)((int)local_70 + 1);
        dVar20 = (double)(ulong)(((uint)((iVar19 + -1) * iVar19 + (iVar14 + -1) * iVar14) >> 1) +
                                local_78._0_4_);
      }
LAB_001088f2:
    } while (((short)uVar17 != 0) && (uVar8 = (int)local_60 + 1, (int)uVar8 < local_4c));
  }
  operator_delete__(__s);
  operator_delete__(pvVar4);
  local_80 = 0;
  pPVar11 = local_58;
  if ((local_58->super_Permutazione).dimensione != 0) {
    do {
      pvVar4 = *(void **)((long)pvVar13 + (long)(int)local_80 * 8);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
        pPVar11 = local_58;
      }
      local_80 = local_80 + 1;
    } while ((int)local_80 < (int)(uint)(pPVar11->super_Permutazione).dimensione);
  }
  operator_delete__(pvVar13);
  return;
}

Assistant:

void PermutazioneT::randomSS(PermutazioneT* p, unsigned short& spostamenti, double F, Coppia* coppie) {

	unsigned short** c = new unsigned short*[p->dimensione];
	unsigned short* lc = new unsigned short [p->dimensione];
	bool* v = new bool[p->dimensione];

	memset(v, 0, sizeof(bool) * p->dimensione);
	memset(lc, 0, sizeof(unsigned short) * p->dimensione);

	unsigned short nc1 = 0, nc = 0;

	int i, j, k, nit = 0, lim, r, nexc = 0, psum, t, lc1, lc2;

	for (i = 0; i < p->dimensione; i++) {
		c[i] = new unsigned short[p->dimensione];
	}

	for (i = 0; i < p->dimensione; i++) {
		if (v[i]) continue;
		j = i;
		while (!v[j]) {
			c[nc][lc[nc]++] = j;
			v[j] = true;
			j = p->individuo[j];
		}
		nc1++; 

		if (lc[nc] > 1) {
			nexc += lc[nc] * (lc[nc] - 1) / 2;
			nc++;
		}
		else
			lc[nc] = 0;
	}

	lim = ceil(F * (p->dimensione - nc1)); 

	spostamenti = 0;
	while (nc > 0 && nit < lim) {

		r = genRand.randIntU(0, nexc-1);
		psum = 0;
		for (k = 0; k < nc; k++) {
			psum += lc[k] * (lc[k] - 1) / 2;
			if (r < psum) break;
		}

		genRand.dueIndiciRandom(lc[k], i, j);

		coppie[spostamenti].x = c[k][i];
		coppie[spostamenti].y = c[k][j];
		spostamenti++;

		nexc -= lc[k] * (lc[k] - 1) / 2; 
		if (i > j) {
			t = i;
			i = j;
			j = t;
		}

		lc1 = i - j + lc[k];	
		lc2 = j - i;			

		if (lc1 > 1 && lc2 > 1) { 

			memcpy(c[nc], c[k] + (i + 1), sizeof(unsigned short) * lc2);
			lc[nc] = lc2;
			nc++;
			
			t = lc[k] - j - 1;	
			if (t > 0) memmove(c[k] + (i + 1), c[k] + (j + 1), sizeof(unsigned short) * t);
			lc[k] = lc1;

			nexc += (lc1 * (lc1 - 1) + lc2 * (lc2 - 1)) / 2;	
		}
		else if (lc1 > 1 && lc2 == 1) { 

			t = lc[k] - j - 1;	
			if (t > 0) memmove(c[k] + (i + 1), c[k] + (j + 1), sizeof(unsigned short) * t);
			lc[k] = lc1;
	
			nexc += lc1 * (lc1 - 1) / 2;
		}
		else if (lc2 > 1) { 

			memmove(c[k], c[k] + (i + 1), sizeof(unsigned short) * lc2);
			lc[k] = lc2;
		
			nexc += lc2 * (lc2 - 1) / 2;	
		}
		else { 

			nc--;
			if (k != nc) {
				memcpy(c[k], c[nc], sizeof(unsigned short) * lc[nc]);
				lc[k] = lc[nc];
			}
			
		}

		nit++;
	}
	delete[] v;
	delete[] lc;

	for (i = 0; i < p->dimensione; i++) {
		delete[] c[i];
	}
	delete[] c;
}